

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftlzw.c
# Opt level: O0

FT_ULong ft_lzw_file_io(FT_LZWFile zip,FT_ULong pos,FT_Byte *buffer,FT_ULong count)

{
  FT_Error FVar1;
  size_t local_40;
  FT_ULong delta;
  FT_ULong FStack_30;
  FT_Error error;
  FT_ULong result;
  FT_ULong count_local;
  FT_Byte *buffer_local;
  FT_ULong pos_local;
  FT_LZWFile zip_local;
  
  FStack_30 = 0;
  if (pos < zip->pos) {
    if ((ulong)((long)zip->cursor - (long)zip->buffer) < zip->pos - pos) {
      FVar1 = ft_lzw_file_reset(zip);
      if (FVar1 != 0) {
        return 0;
      }
    }
    else {
      zip->cursor = zip->cursor + -(zip->pos - pos);
      zip->pos = pos;
    }
  }
  if (((pos <= zip->pos) || (FVar1 = ft_lzw_file_skip_output(zip,pos - zip->pos), FVar1 == 0)) &&
     (result = count, count != 0)) {
    do {
      local_40 = (long)zip->limit - (long)zip->cursor;
      if (result <= local_40) {
        local_40 = result;
      }
      memcpy(buffer + FStack_30,zip->cursor,local_40);
      FStack_30 = local_40 + FStack_30;
      zip->cursor = zip->cursor + local_40;
      zip->pos = local_40 + zip->pos;
      result = result - local_40;
    } while ((result != 0) && (FVar1 = ft_lzw_file_fill_output(zip), FVar1 == 0));
  }
  return FStack_30;
}

Assistant:

static FT_ULong
  ft_lzw_file_io( FT_LZWFile  zip,
                  FT_ULong    pos,
                  FT_Byte*    buffer,
                  FT_ULong    count )
  {
    FT_ULong  result = 0;
    FT_Error  error;


    /* seeking backwards. */
    if ( pos < zip->pos )
    {
      /* If the new position is within the output buffer, simply       */
      /* decrement pointers, otherwise we reset the stream completely! */
      if ( ( zip->pos - pos ) <= (FT_ULong)( zip->cursor - zip->buffer ) )
      {
        zip->cursor -= zip->pos - pos;
        zip->pos     = pos;
      }
      else
      {
        error = ft_lzw_file_reset( zip );
        if ( error )
          goto Exit;
      }
    }

    /* skip unwanted bytes */
    if ( pos > zip->pos )
    {
      error = ft_lzw_file_skip_output( zip, (FT_ULong)( pos - zip->pos ) );
      if ( error )
        goto Exit;
    }

    if ( count == 0 )
      goto Exit;

    /* now read the data */
    for (;;)
    {
      FT_ULong  delta;


      delta = (FT_ULong)( zip->limit - zip->cursor );
      if ( delta >= count )
        delta = count;

      FT_MEM_COPY( buffer + result, zip->cursor, delta );
      result      += delta;
      zip->cursor += delta;
      zip->pos    += delta;

      count -= delta;
      if ( count == 0 )
        break;

      error = ft_lzw_file_fill_output( zip );
      if ( error )
        break;
    }

  Exit:
    return result;
  }